

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::ColumnChunk::printTo(ColumnChunk *this,ostream *out)

{
  _ColumnChunk__isset _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"ColumnChunk(",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(out,"file_path=",10);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>(&local_48,(thrift *)&this->file_path,t);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  if ((((byte)_Var1 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"file_offset=",0xc);
  duckdb_apache::thrift::to_string<long>(&local_128,&this->file_offset);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"meta_data=",10);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::ColumnMetaData>(&local_128,&this->meta_data);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  }
  if ((((byte)_Var1 & 2) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2)) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"offset_index_offset=",0x14);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_68,&this->offset_index_offset);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  if ((((byte)_Var1 & 4) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"offset_index_length=",0x14);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_88,&this->offset_index_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_88._M_dataplus._M_p,local_88._M_string_length);
  }
  if ((((byte)_Var1 & 8) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"column_index_offset=",0x14);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 0x10) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_a8,&this->column_index_offset);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  }
  if ((((byte)_Var1 & 0x10) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"column_index_length=",0x14);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 0x20) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_c8,&this->column_index_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  }
  if ((((byte)_Var1 & 0x20) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"crypto_metadata=",0x10);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 0x40) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::ColumnCryptoMetaData>
              (&local_e8,&this->crypto_metadata);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_e8._M_dataplus._M_p,local_e8._M_string_length);
  }
  if ((((byte)_Var1 & 0x40) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2)) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"encrypted_column_metadata=",0x1a);
  if ((char)this->__isset < '\0') {
    duckdb_apache::thrift::to_string<std::__cxx11::string>
              (&local_108,(thrift *)&this->encrypted_column_metadata,t_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_108._M_dataplus._M_p,local_108._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void ColumnChunk::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnChunk(";
  out << "file_path="; (__isset.file_path ? (out << to_string(file_path)) : (out << "<null>"));
  out << ", " << "file_offset=" << to_string(file_offset);
  out << ", " << "meta_data="; (__isset.meta_data ? (out << to_string(meta_data)) : (out << "<null>"));
  out << ", " << "offset_index_offset="; (__isset.offset_index_offset ? (out << to_string(offset_index_offset)) : (out << "<null>"));
  out << ", " << "offset_index_length="; (__isset.offset_index_length ? (out << to_string(offset_index_length)) : (out << "<null>"));
  out << ", " << "column_index_offset="; (__isset.column_index_offset ? (out << to_string(column_index_offset)) : (out << "<null>"));
  out << ", " << "column_index_length="; (__isset.column_index_length ? (out << to_string(column_index_length)) : (out << "<null>"));
  out << ", " << "crypto_metadata="; (__isset.crypto_metadata ? (out << to_string(crypto_metadata)) : (out << "<null>"));
  out << ", " << "encrypted_column_metadata="; (__isset.encrypted_column_metadata ? (out << to_string(encrypted_column_metadata)) : (out << "<null>"));
  out << ")";
}